

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans_byte.hpp
# Opt level: O2

void __thiscall
ans_byte_encode::encode_symbol(ans_byte_encode *this,uint64_t *state,uint8_t sym,uint8_t **out_u8)

{
  ushort *puVar1;
  uint8_t *puVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  
  uVar3 = *state;
  puVar1 = (ushort *)
           ((long)&(this->table)._M_elems[0].freq +
           (ulong)(uint)((int)CONCAT71(in_register_00000011,sym) << 4));
  if (*(ulong *)(puVar1 + 4) <= uVar3) {
    puVar2 = *out_u8;
    *(int *)puVar2 = (int)uVar3;
    uVar3 = uVar3 >> 0x20;
    *out_u8 = puVar2 + 4;
    *state = uVar3;
  }
  *state = (ulong)puVar1[1] + uVar3 % (ulong)*puVar1 + (uVar3 / *puVar1) * this->frame_size;
  return;
}

Assistant:

void encode_symbol(uint64_t& state, uint8_t sym, uint8_t*& out_u8)
    {
        const auto& e = table[sym];
        if (state >= e.sym_upper_bound) {
            auto out_ptr_u32 = reinterpret_cast<uint32_t*>(out_u8);
            *out_ptr_u32 = state & 0xFFFFFFFF;
            out_u8 += sizeof(uint32_t);
            state = state >> constants::RADIX_LOG2;
        }
        state = ((state / e.freq) * frame_size) + (state % e.freq) + e.base;
    }